

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printAssignName(JSPrinter *this,Ref node)

{
  AssignName *this_00;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  const_pointer s;
  Ref *pRVar1;
  AssignName *assign;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  Ref::operator->((Ref *)&this_local);
  this_00 = (AssignName *)cashew::Value::asAssignName();
  this_01 = &AssignName::target(this_00)->str;
  s = std::basic_string_view<char,_std::char_traits<char>_>::data(this_01);
  emit(this,s);
  space(this);
  emit(this,'=');
  space(this);
  pRVar1 = AssignName::value(this_00);
  printChild(this,pRVar1->inst,(Ref)this_local,1);
  return;
}

Assistant:

void printAssignName(Ref node) {
    auto* assign = node->asAssignName();
    emit(assign->target().str.data());
    space();
    emit('=');
    space();
    printChild(assign->value(), node, 1);
  }